

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

size_t upb_MtDecoder_SizeOfRep(upb_FieldRep rep,upb_MiniTablePlatform platform)

{
  byte bVar1;
  uint local_14;
  upb_MiniTablePlatform platform_local;
  upb_FieldRep rep_local;
  
  if (platform == kUpb_MiniTablePlatform_32Bit) {
    bVar1 = "\x01\x04\b\b"[rep];
  }
  else {
    bVar1 = "\x01\x04\x10\b"[rep];
  }
  local_14 = (uint)bVar1;
  return (long)(int)local_14;
}

Assistant:

static size_t upb_MtDecoder_SizeOfRep(upb_FieldRep rep,
                                      upb_MiniTablePlatform platform) {
  static const uint8_t kRepToSize32[] = {
      [kUpb_FieldRep_1Byte] = 1,
      [kUpb_FieldRep_4Byte] = 4,
      [kUpb_FieldRep_StringView] = 8,
      [kUpb_FieldRep_8Byte] = 8,
  };
  static const uint8_t kRepToSize64[] = {
      [kUpb_FieldRep_1Byte] = 1,
      [kUpb_FieldRep_4Byte] = 4,
      [kUpb_FieldRep_StringView] = 16,
      [kUpb_FieldRep_8Byte] = 8,
  };
  UPB_ASSERT(sizeof(upb_StringView) ==
             UPB_SIZE(kRepToSize32, kRepToSize64)[kUpb_FieldRep_StringView]);
  return platform == kUpb_MiniTablePlatform_32Bit ? kRepToSize32[rep]
                                                  : kRepToSize64[rep];
}